

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster.c
# Opt level: O2

int access_monster_buffer(void *buffer)

{
  int *piVar1;
  int *piVar2;
  float fVar3;
  ushort uVar4;
  ushort uVar5;
  int16_t iVar6;
  int iVar7;
  ulong uVar8;
  MyGame_Sample_Weapon_table_t pMVar9;
  flatbuffers_string_t pcVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  char *i;
  int *__s1;
  MyGame_Sample_Weapon_vec_t vec;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  
  if (buffer == (void *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xd3,"int access_monster_buffer(const void *)");
  }
  piVar1 = (int *)((long)buffer + (ulong)*buffer);
  lVar12 = (long)*(int *)((long)buffer + (ulong)*buffer);
  lVar13 = -lVar12;
  uVar4 = *(ushort *)((long)piVar1 - lVar12);
  if (uVar4 < 10) {
    if (uVar4 < 8) goto LAB_001039f1;
LAB_0010373e:
    bVar14 = false;
  }
  else {
    uVar8 = (ulong)*(ushort *)((long)piVar1 + lVar13 + 8);
    if (uVar8 == 0) goto LAB_0010373e;
    bVar14 = *(short *)((long)piVar1 + uVar8) == 300;
  }
  uVar8 = (ulong)*(ushort *)((long)piVar1 + lVar13 + 6);
  if (uVar8 == 0) {
    bVar15 = true;
  }
  else {
    bVar15 = *(short *)((long)piVar1 + uVar8) == 0x96;
  }
  if ((uVar4 < 0xc) || (uVar11 = (ulong)*(ushort *)((long)piVar1 + lVar13 + 10), uVar11 == 0)) {
    __s1 = (int *)0x0;
    bVar16 = false;
  }
  else {
    piVar2 = (int *)((long)piVar1 + *(uint *)((long)piVar1 + uVar11) + uVar11);
    __s1 = piVar2 + 1;
    bVar16 = *piVar2 == 3;
  }
  if (bVar14) {
    if (!bVar15) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                    ,0xdd,"int access_monster_buffer(const void *)");
    }
    i = "Orc";
    iVar7 = strcmp((char *)__s1,"Orc");
    if (iVar7 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                    ,0xde,"int access_monster_buffer(const void *)");
    }
    if (!bVar16) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                    ,0xdf,"int access_monster_buffer(const void *)");
    }
    if ((uVar4 < 10) || (*(short *)((long)piVar1 + lVar13 + 8) == 0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                    ,0xe3,"int access_monster_buffer(const void *)");
    }
    if (uVar8 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                    ,0xe4,"int access_monster_buffer(const void *)");
    }
    uVar5 = *(ushort *)((long)piVar1 + lVar13 + 4);
    if (uVar5 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                    ,0xe8,"int access_monster_buffer(const void *)");
    }
    uVar8 = (ulong)uVar5;
    if ((*(float *)((long)piVar1 + uVar8) != 1.0) || (NAN(*(float *)((long)piVar1 + uVar8)))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                    ,0xf0,"int access_monster_buffer(const void *)");
    }
    fVar3 = *(float *)((long)piVar1 + uVar8 + 4);
    if ((fVar3 == 2.0) && (!NAN(fVar3))) {
      fVar3 = *(float *)((long)piVar1 + uVar8 + 8);
      if ((fVar3 != 3.0) || (NAN(fVar3))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                      ,0xf2,"int access_monster_buffer(const void *)");
      }
      if ((0xf < uVar4) && (uVar8 = (ulong)*(ushort *)((long)piVar1 + lVar13 + 0xe), uVar8 != 0)) {
        if (*(int *)((long)piVar1 + *(uint *)((long)piVar1 + uVar8) + uVar8) != 10) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                        ,0x107,"int access_monster_buffer(const void *)");
        }
        if (*(char *)((long)piVar1 + (ulong)*(uint *)((long)piVar1 + uVar8) + uVar8 + 6) == '\x02')
        {
          if ((0x13 < uVar4) &&
             (uVar8 = (ulong)*(ushort *)((long)piVar1 + lVar13 + 0x12), uVar8 != 0)) {
            if (*(int *)((long)piVar1 + *(uint *)((long)piVar1 + uVar8) + uVar8) == 2) {
              vec = (MyGame_Sample_Weapon_vec_t)
                    ((long)piVar1 + *(uint *)((long)piVar1 + uVar8) + uVar8 + 4);
              pMVar9 = MyGame_Sample_Weapon_vec_at(vec,(size_t)i);
              pcVar10 = MyGame_Sample_Weapon_name(pMVar9);
              pMVar9 = MyGame_Sample_Weapon_vec_at(vec,(size_t)i);
              iVar6 = MyGame_Sample_Weapon_damage(pMVar9);
              if (pcVar10 != (flatbuffers_string_t)0x0) {
                iVar7 = strcmp(pcVar10,"Axe");
                if (iVar7 == 0) {
                  if (iVar6 != 5) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                                  ,0x114,"int access_monster_buffer(const void *)");
                  }
                  uVar4 = *(ushort *)((long)piVar1 - (long)*piVar1);
                  if (0x15 < uVar4) {
                    lVar12 = -(long)*piVar1;
                    uVar8 = (ulong)*(ushort *)((long)piVar1 + lVar12 + 0x14);
                    if ((uVar8 != 0) && (*(char *)((long)piVar1 + uVar8) == '\x01')) {
                      if ((uVar4 < 0x18) ||
                         (uVar8 = (ulong)*(ushort *)((long)piVar1 + lVar12 + 0x16), uVar8 == 0)) {
                        pMVar9 = (MyGame_Sample_Weapon_table_t)0x0;
                      }
                      else {
                        pMVar9 = (MyGame_Sample_Weapon_table_t)
                                 ((long)piVar1 + *(uint *)((long)piVar1 + uVar8) + uVar8);
                      }
                      pcVar10 = MyGame_Sample_Weapon_name(pMVar9);
                      iVar6 = MyGame_Sample_Weapon_damage(pMVar9);
                      iVar7 = strcmp(pcVar10,"Axe");
                      if (iVar7 != 0) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                                      ,0x11e,"int access_monster_buffer(const void *)");
                      }
                      if (iVar6 != 5) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                                      ,0x11f,"int access_monster_buffer(const void *)");
                      }
                    }
                  }
                  return 0;
                }
              }
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                            ,0x113,"int access_monster_buffer(const void *)");
            }
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                        ,0x10f,"int access_monster_buffer(const void *)");
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                      ,0x10b,"int access_monster_buffer(const void *)");
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                    ,0x105,"int access_monster_buffer(const void *)");
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                  ,0xf1,"int access_monster_buffer(const void *)");
  }
LAB_001039f1:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/test/monster_test_cpp/../../samples/monster/monster.c"
                ,0xdb,"int access_monster_buffer(const void *)");
}

Assistant:

int access_monster_buffer(const void *buffer)
{
    // Note that we use the `table_t` suffix when reading a table object
    // as opposed to the `ref_t` suffix used during the construction of
    // the buffer.
    ns(Monster_table_t) monster = ns(Monster_as_root(buffer));

    // Note: root object pointers are NOT the same as the `buffer` pointer.

    // Make sure the buffer is accessible.
    test_assert(monster != 0);

    int16_t hp = ns(Monster_hp(monster));
    int16_t mana = ns(Monster_mana(monster));
    // This is just a const char *, but it also supports a fast length operation.
    flatbuffers_string_t name = ns(Monster_name(monster));
    size_t name_len = flatbuffers_string_len(name);

    test_assert(hp == 300);
    // Since 150 is the default, we are reading a value that wasn't stored.
    test_assert(mana == 150);
    test_assert(0 == strcmp(name, "Orc"));
    test_assert(name_len == strlen("Orc"));

    int hp_present = ns(Monster_hp_is_present(monster)); // 1
    int mana_present = ns(Monster_mana_is_present(monster)); // 0
    test_assert(hp_present);
    test_assert(!mana_present);

    ns(Vec3_struct_t) pos = ns(Monster_pos(monster));
    // Make sure pos has been set.
    test_assert(pos != 0);
    float x = ns(Vec3_x(pos));
    float y = ns(Vec3_y(pos));
    float z = ns(Vec3_z(pos));

    // The literal `f` suffix is important because double literals does
    // not always map cleanly to 32-bit represention even with only a few digits:
    // `1.0 == 1.0f`, but `3.2 != 3.2f`.
    test_assert(x == 1.0f);
    test_assert(y == 2.0f);
    test_assert(z == 3.0f);

    // We can also read the position into a C-struct. We have to copy
    // because we generally do not know if the native endian format
    // matches the one stored in the buffer (pe: protocol endian).
    ns(Vec3_t) pos_vec;
    // `pe` indicates endian conversion from protocol to native.
    ns(Vec3_copy_from_pe(&pos_vec, pos));
    test_assert(pos_vec.x == 1.0f);
    test_assert(pos_vec.y == 2.0f);
    test_assert(pos_vec.z == 3.0f);

    // This is a const uint8_t *, but it shouldn't be accessed directly
    // to ensure proper endian conversion. However, uint8 (ubyte) are
    // not sensitive endianness, so we *could* have accessed it directly.
    // The compiler likely optimizes this so that it doesn't matter.
    flatbuffers_uint8_vec_t inv = ns(Monster_inventory(monster));
    size_t inv_len = flatbuffers_uint8_vec_len(inv);
    // Make sure the inventory has been set.
    test_assert(inv != 0);
    // If `inv` were absent, the length would 0, so the above test is redundant.
    test_assert(inv_len == 10);
    // Index 0 is the first, index 2 is the third.
    // NOTE: C++ uses the `Get` terminology for vector elemetns, C use `at`.
    uint8_t third_item = flatbuffers_uint8_vec_at(inv, 2);
    test_assert(third_item == 2);

    ns(Weapon_vec_t) weapons = ns(Monster_weapons(monster));
    size_t weapons_len = ns(Weapon_vec_len(weapons));
    test_assert(weapons_len == 2);
    // We can use `const char *` instead of `flatbuffers_string_t`.
    const char *second_weapon_name = ns(Weapon_name(ns(Weapon_vec_at(weapons, 1))));
    int16_t second_weapon_damage =  ns(Weapon_damage(ns(Weapon_vec_at(weapons, 1))));
    test_assert(second_weapon_name != 0 && strcmp(second_weapon_name, "Axe") == 0);
    test_assert(second_weapon_damage == 5);

    // Access union type field.
    if (ns(Monster_equipped_type(monster)) == ns(Equipment_Weapon)) {
        // Cast to appropriate type:
        // C does not require the cast to Weapon_table_t, but C++ does.
        ns(Weapon_table_t) weapon = (ns(Weapon_table_t)) ns(Monster_equipped(monster));
        const char *weapon_name = ns(Weapon_name(weapon));
        int16_t weapon_damage = ns(Weapon_damage(weapon));

        test_assert(0 == strcmp(weapon_name, "Axe"));
        test_assert(weapon_damage == 5);
    }
    return 0;
}